

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDocument.cpp
# Opt level: O2

BreakpointProbe * __thiscall
Js::DebugDocument::SetBreakPoint_TTDWbpId
          (DebugDocument *this,int64 bpId,StatementLocation statement)

{
  ScriptContext *this_00;
  ArenaAllocator *alloc;
  BreakpointProbe *this_01;
  DebugContext *pDVar1;
  BreakpointProbeList *this_02;
  BreakpointProbe *local_30;
  BreakpointProbe *pProbe;
  
  this_00 = (this->utf8SourceInfo->m_scriptContext).ptr;
  alloc = ScriptContext::AllocatorForDiagnostics(this_00);
  this_01 = (BreakpointProbe *)new<Memory::ArenaAllocator>(0x28,alloc,0x35916e);
  BreakpointProbe::BreakpointProbe(this_01,this,&statement,(int)bpId);
  local_30 = this_01;
  pDVar1 = ScriptContext::GetDebugContext(this_00);
  ProbeContainer::AddProbe(pDVar1->diagProbesContainer,(Probe *)this_01);
  this_02 = GetBreakpointList(this);
  JsUtil::
  List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this_02,&local_30);
  return local_30;
}

Assistant:

BreakpointProbe* DebugDocument::SetBreakPoint_TTDWbpId(int64 bpId, StatementLocation statement)
    {
        ScriptContext* scriptContext = this->utf8SourceInfo->GetScriptContext();
        BreakpointProbe* pProbe = Anew(scriptContext->AllocatorForDiagnostics(), BreakpointProbe, this, statement, (uint32)bpId);

        scriptContext->GetDebugContext()->GetProbeContainer()->AddProbe(pProbe);
        BreakpointProbeList* pBreakpointList = this->GetBreakpointList();
        pBreakpointList->Add(pProbe);
        return pProbe;
    }